

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testElementTraversal(DOMTest *this)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  short *psVar6;
  XMLCh *pXVar7;
  long *plVar8;
  undefined8 uVar9;
  MemBufInputSource is;
  
  xercesc_4_0::MemBufInputSource::MemBufInputSource
            (&is,(uchar *)
                 "<?xml version=\'1.0\'?><!DOCTYPE g [<!ENTITY ent1 \'<nestedEl>&ent2;</nestedEl>\'><!ENTITY ent2 \'text\'>]><g id=\'shapeGroup\'>\n\n\t<rect id=\'rect1\' x=\'5\' y=\'5\' width=\'310\' height=\'220\' rx=\'15\' ry=\'15\' fill=\'skyblue\'/>\n\t<rect id=\'rect2\' x=\'15\' y=\'15\' width=\'210\' height=\'180\' rx=\'15\' ry=\'15\' fill=\'cornflowerblue\'/>\n\n\t<ellipse id=\'ellipse1\' cx=\'90\' cy=\'70\' rx=\'50\' ry=\'30\' fill=\'yellow\' stroke=\'orange\'/>\n\n\t<path id=\'path1\' stroke-width=\'15\' stroke=\'orange\' fill=\'none\' stroke-linecap=\'round\'\n\t\td=\'M25,150 C180,180 290,0 400,140 S420,100 460,90\'/>\n\t<text id=\'text1\' x=\'0\' y=\'0\' font-size=\'35\' fill=\'yellow\' stroke=\'orange\'\n\t\tstroke-width=\'2\' stroke-linejoin=\'round\' font-weight=\'bold\'>\n\t\t<textPath id=\'textPath1\' href=\'#path1\'>&ent1;&ent2;&ent1;</textPath></text>\n</g>"
             ,0x2f7,"bufId",false,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x10))
                             (plVar3,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x20))
                             (plVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><!DOCTYPE g [<!ENTITY ent1 \'<nestedEl>&ent2;</nestedEl>\'><!ENTITY ent2 \'text\'>]><g id=\'shapeGroup\'>\n\n\t<rect id=\'rect1\' x=\'5\' y=\'5\' width=\'310\' height=\'220\' rx=\'15\' ry=\'15\' fill=\'skyblue\'/>\n\t<rect id=\'rect2\' x=\'15\' y=\'15\' width=\'210\' height=\'180\' rx=\'15\' ry=\'15\' fill=\'cornflowerblue\'/>\n\n\t<ellipse id=\'ellipse1\' cx=\'90\' cy=\'70\' rx=\'50\' ry=\'30\' fill=\'yellow\' stroke=\'orange\'/>\n\n\t<path id=\'path1\' stroke-width=\'15\' stroke=\'orange\' fill=\'none\' stroke-linecap=\'round\'\n\t\td=\'M25,150 C180,180 290,0 400,140 S420,100 460,90\'/>\n\t<text id=\'text1\' x=\'0\' y=\'0\' font-size=\'35\' fill=\'yellow\' stroke=\'orange\'\n\t\tstroke-width=\'2\' stroke-linejoin=\'round\' font-weight=\'bold\'>\n\t\t<textPath id=\'textPath1\' href=\'#path1\'>&ent1;&ent2;&ent1;</textPath></text>\n</g>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar3 + 0x40))(plVar3,tempStr);
  plVar3 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x30))(plVar4);
  lVar5 = (**(code **)(*plVar4 + 0x18))(plVar4);
  if (lVar5 == 0xb) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
    plVar4 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4);
    uVar9 = 0x144d;
    if (((plVar4 != (long *)0x0) && (iVar2 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar2 == 3)) &&
       (psVar6 = (short *)(**(code **)(*plVar4 + 0x18))(plVar4), *psVar6 != 0xd)) {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
      plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
      xercesc_4_0::XMLString::transcode
                ("id",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::XMLString::transcode
                ("rect1",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      uVar9 = 0x1455;
      if ((plVar4 != (long *)0x0) && (iVar2 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar2 == 1)) {
        pXVar7 = (XMLCh *)(**(code **)(*plVar4 + 0x148))(plVar4,tempStr);
        bVar1 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
        if (bVar1) {
          lVar5 = 5;
          while (plVar4 != (long *)0x0) {
            plVar4 = (long *)(**(code **)(*plVar4 + 0x1f8))(plVar4);
            lVar5 = lVar5 + -1;
          }
          if (lVar5 == 0) {
            plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
            lVar5 = (**(code **)(*plVar4 + 0x200))(plVar4);
            if (lVar5 == 5) {
              plVar3 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
              plVar3 = (long *)(**(code **)(*plVar3 + 0x1e8))(plVar3);
              xercesc_4_0::XMLString::transcode
                        ("id",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              xercesc_4_0::XMLString::transcode
                        ("text1",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              uVar9 = 0x146e;
              if ((plVar3 != (long *)0x0) &&
                 (iVar2 = (**(code **)(*plVar3 + 0x20))(plVar3), iVar2 == 1)) {
                pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x148))(plVar3,tempStr);
                bVar1 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
                if (bVar1) {
                  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))(plVar3);
                  xercesc_4_0::XMLString::transcode
                            ("id",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
                  xercesc_4_0::XMLString::transcode
                            ("textPath1",tempStr2,3999,
                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
                  uVar9 = 0x1476;
                  if ((plVar3 != (long *)0x0) &&
                     (iVar2 = (**(code **)(*plVar3 + 0x20))(plVar3), iVar2 == 1)) {
                    pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x148))(plVar3,tempStr);
                    bVar1 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
                    if (bVar1) {
                      lVar5 = (**(code **)(*plVar3 + 0x200))(plVar3);
                      if (lVar5 == 2) {
                        plVar4 = (long *)(**(code **)(*plVar3 + 0x1e0))(plVar3);
                        uVar9 = 0x1482;
                        if ((plVar4 != (long *)0x0) &&
                           (iVar2 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar2 == 1)) {
                          plVar3 = (long *)(**(code **)(*plVar3 + 0x1e8))(plVar3);
                          uVar9 = 0x1488;
                          if ((plVar3 != (long *)0x0) &&
                             (iVar2 = (**(code **)(*plVar3 + 0x20))(plVar3), iVar2 == 1)) {
                            plVar8 = (long *)(**(code **)(*plVar4 + 0x1f8))(plVar4);
                            uVar9 = 0x148d;
                            if (plVar8 == plVar3) {
                              plVar3 = (long *)(**(code **)(*plVar3 + 0x1f0))(plVar3);
                              bVar1 = true;
                              if (plVar4 == plVar3) goto LAB_00119dd5;
                            }
                          }
                        }
                      }
                      else {
                        uVar9 = 0x147c;
                      }
                    }
                  }
                }
              }
            }
            else {
              uVar9 = 0x1466;
            }
          }
          else {
            uVar9 = 0x1460;
          }
        }
      }
    }
  }
  else {
    uVar9 = 0x1447;
  }
  bVar1 = false;
  fprintf(_stderr,"checking ElementTraversal failed at line %i\n",uVar9);
LAB_00119dd5:
  xercesc_4_0::MemBufInputSource::~MemBufInputSource(&is);
  return bVar1;
}

Assistant:

bool DOMTest::testElementTraversal() {
	const char* sXml="<?xml version='1.0'?>"
				"<!DOCTYPE g ["
                "<!ENTITY ent1 '<nestedEl>&ent2;</nestedEl>'>"
                "<!ENTITY ent2 'text'>"
                "]>"
				"<g id='shapeGroup'>\n"
                "\n"
                "\t<rect id='rect1' x='5' y='5' width='310' height='220' rx='15' ry='15' fill='skyblue'/>\n"
                "\t<rect id='rect2' x='15' y='15' width='210' height='180' rx='15' ry='15' fill='cornflowerblue'/>\n"
                "\n"
                "\t<ellipse id='ellipse1' cx='90' cy='70' rx='50' ry='30' fill='yellow' stroke='orange'/>\n"
                "\n"
                "\t<path id='path1' stroke-width='15' stroke='orange' fill='none' stroke-linecap='round'\n"
                "\t\td='M25,150 C180,180 290,0 400,140 S420,100 460,90'/>\n"
                "\t<text id='text1' x='0' y='0' font-size='35' fill='yellow' stroke='orange'\n"
                "\t\tstroke-width='2' stroke-linejoin='round' font-weight='bold'>\n"
                "\t\t<textPath id='textPath1' href='#path1'>&ent1;&ent2;&ent1;</textPath></text>\n"
                "</g>";
	MemBufInputSource is((XMLByte*)sXml, strlen(sXml), "bufId");

    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementationLS *impl = (DOMImplementationLS*)DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *domBuilder = impl->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMLSInput        *input = impl->createLSInput();
    XMLString::transcode(sXml, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        DOMDocument* doc=domBuilder->parse(input);

        XMLSize_t c = doc->getDocumentElement()->getChildNodes()->getLength();
	    if(c!=11)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMNode* firstNode = doc->getDocumentElement()->getFirstChild();
        if(firstNode==NULL || firstNode->getNodeType()!=DOMNode::TEXT_NODE || *firstNode->getNodeValue()=='\r')
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* childNode = doc->getDocumentElement()->getFirstElementChild();
        XMLString::transcode("id", tempStr, 3999);
        XMLString::transcode("rect1", tempStr2, 3999);
        if(childNode==NULL || childNode->getNodeType()!=DOMNode::ELEMENT_NODE || !XMLString::equals(childNode->getAttribute(tempStr),tempStr2))
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        XMLSize_t count=0;
        while(childNode!=NULL)
        {
            count++;
            childNode=childNode->getNextElementSibling();
        }
        if(count!=5)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        count = doc->getDocumentElement()->getChildElementCount();
        if(count!=5)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* text=doc->getDocumentElement()->getLastElementChild();
        XMLString::transcode("id", tempStr, 3999);
        XMLString::transcode("text1", tempStr2, 3999);
        if(text==NULL || text->getNodeType()!=DOMNode::ELEMENT_NODE || !XMLString::equals(text->getAttribute(tempStr),tempStr2))
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* textPath=text->getFirstElementChild();
        XMLString::transcode("id", tempStr, 3999);
        XMLString::transcode("textPath1", tempStr2, 3999);
        if(textPath==NULL || textPath->getNodeType()!=DOMNode::ELEMENT_NODE || !XMLString::equals(textPath->getAttribute(tempStr),tempStr2))
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        count = textPath->getChildElementCount();
        if(count!=2)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* insideEntity=textPath->getFirstElementChild();
        if(insideEntity==NULL || insideEntity->getNodeType()!=DOMNode::ELEMENT_NODE)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* insideEntity2=textPath->getLastElementChild();
        if(insideEntity2==NULL || insideEntity2->getNodeType()!=DOMNode::ELEMENT_NODE)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        if(insideEntity->getNextElementSibling()!=insideEntity2 || insideEntity!=insideEntity2->getPreviousElementSibling())
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        return true;
    }
    catch(DOMLSException&)
    {
        fprintf(stderr, "checking testElementTraversal failed at line %i\n",  __LINE__);
        return false;
    }

    input->release();
    domBuilder->release();

    return true;
}